

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

void __thiscall DistanceGraph::disconnect_node(DistanceGraph *this,sgNodeID_t node)

{
  pointer pLVar1;
  pointer pLVar2;
  vector<Link,_std::allocator<Link>_> local_38;
  
  get_fw_links(&local_38,this,node);
  pLVar2 = local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pLVar1 = local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar1 != pLVar2; pLVar1 = pLVar1 + 1) {
    remove_link(this,pLVar1->source,pLVar1->dest);
  }
  if (local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  get_fw_links(&local_38,this,-node);
  for (pLVar2 = local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar2 != local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_finish; pLVar2 = pLVar2 + 1) {
    remove_link(this,pLVar2->source,pLVar2->dest);
  }
  if (local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DistanceGraph::disconnect_node(sgNodeID_t node) {
    for (auto fwl:get_fw_links(node)) remove_link(fwl.source,fwl.dest);
    for (auto bwl:get_bw_links(node)) remove_link(bwl.source,bwl.dest);
}